

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void duckdb_parquet::swap(DataPageHeaderV2 *a,DataPageHeaderV2 *b)

{
  Statistics *in_RSI;
  long in_RDI;
  Statistics *in_stack_ffffffffffffffe8;
  
  std::swap<int>((int *)(in_RDI + 8),(int *)&in_RSI->max);
  std::swap<int>((int *)(in_RDI + 0xc),(int *)&in_RSI->field_0xc);
  std::swap<int>((int *)(in_RDI + 0x10),(int *)&in_RSI->field_0x10);
  std::swap<duckdb_parquet::Encoding::type>((type *)(in_RDI + 0x14),(type *)&in_RSI->field_0x14);
  std::swap<int>((int *)(in_RDI + 0x18),(int *)&in_RSI->field_0x18);
  std::swap<int>((int *)(in_RDI + 0x1c),(int *)&in_RSI->field_0x1c);
  std::swap<bool>((bool *)(in_RDI + 0x20),(bool *)&in_RSI->field_0x20);
  swap(in_RSI,in_stack_ffffffffffffffe8);
  std::swap<duckdb_parquet::_DataPageHeaderV2__isset>
            ((_DataPageHeaderV2__isset *)(in_RDI + 200),(_DataPageHeaderV2__isset *)&in_RSI[1].min);
  return;
}

Assistant:

void swap(DataPageHeaderV2 &a, DataPageHeaderV2 &b) {
  using ::std::swap;
  swap(a.num_values, b.num_values);
  swap(a.num_nulls, b.num_nulls);
  swap(a.num_rows, b.num_rows);
  swap(a.encoding, b.encoding);
  swap(a.definition_levels_byte_length, b.definition_levels_byte_length);
  swap(a.repetition_levels_byte_length, b.repetition_levels_byte_length);
  swap(a.is_compressed, b.is_compressed);
  swap(a.statistics, b.statistics);
  swap(a.__isset, b.__isset);
}